

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void ScalePlaneBilinearUp_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  void *__ptr;
  ulong uVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  long in_stack_00000008;
  int in_stack_00000018;
  int yf;
  int lasty;
  int rowstride;
  uint16_t *rowptr;
  uint8_t *row;
  uint8_t *row_mem;
  int kRowSize;
  uint16_t *src;
  int yi;
  _func_void_uint16_t_ptr_uint16_t_ptr_int_int_int *ScaleFilterCols;
  _func_void_uint16_t_ptr_uint16_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  int max_y;
  int dy;
  int dx;
  int y;
  int x;
  int j;
  int *piVar6;
  int width;
  ptrdiff_t in_stack_ffffffffffffff70;
  code *src_ptr_00;
  undefined4 in_stack_ffffffffffffff80;
  FilterMode in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  int local_44;
  code *local_40;
  int local_2c;
  undefined4 local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  iVar1 = (in_ESI + -1) * 0x10000;
  if (in_stack_00000018 == 0) {
    local_40 = ScaleCols_16_C;
  }
  else {
    local_40 = ScaleFilterCols_16_C;
  }
  piVar6 = &local_2c;
  src_ptr_00 = local_40;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  ScaleSlope((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             (int *)local_40,in_stack_ffffffffffffffa0,
             (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffb0);
  local_4 = libyuv::Abs(local_4);
  if ((in_stack_00000018 != 0) && (0x7fff < local_4)) {
    local_40 = ScaleFilterCols64_16_C;
  }
  if (((in_stack_00000018 == 0) && (local_4 << 1 == local_c)) && (local_20 < 0x8000)) {
    local_40 = ScaleColsUp2_16_C;
  }
  if (iVar1 < local_24) {
    local_24 = iVar1;
  }
  iVar2 = local_24 >> 0x10;
  lVar4 = in_stack_00000008 + (long)(iVar2 * local_14) * 2;
  uVar3 = local_c + 0x1fU & 0xffffffe0;
  __ptr = malloc((long)(int)(uVar3 * 4 + 0x3f));
  uVar5 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
  (*local_40)(uVar5,lVar4,local_c,local_20,local_28);
  if (1 < local_8) {
    lVar4 = lVar4 + (long)local_14 * 2;
  }
  (*local_40)(uVar5 + (long)(int)uVar3 * 2,lVar4,local_c,local_20,local_28);
  lVar4 = lVar4 + (long)local_14 * 2;
  for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
    local_44 = local_24 >> 0x10;
    if (local_44 != iVar2) {
      if (iVar1 < local_24) {
        local_44 = iVar1 >> 0x10;
        lVar4 = in_stack_00000008 + (long)(local_44 * local_14) * 2;
        local_24 = iVar1;
      }
      if (local_44 != iVar2) {
        (*local_40)(uVar5,lVar4,local_c,local_20,local_28);
        uVar5 = uVar5 + (long)(int)uVar3 * 2;
        uVar3 = -uVar3;
        lVar4 = lVar4 + (long)local_14 * 2;
        iVar2 = local_44;
      }
    }
    width = (int)((ulong)piVar6 >> 0x20);
    if (in_stack_00000018 == 1) {
      InterpolateRow_16_C((uint16_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (uint16_t *)src_ptr_00,in_stack_ffffffffffffff70,width,(int)piVar6);
    }
    else {
      in_stack_ffffffffffffff84 = local_24 >> 8 & 0xff;
      InterpolateRow_16_C((uint16_t *)
                          (CONCAT44(local_24 >> 8,in_stack_ffffffffffffff80) & 0xffffffffff),
                          (uint16_t *)src_ptr_00,in_stack_ffffffffffffff70,width,(int)piVar6);
    }
    local_24 = local_2c + local_24;
  }
  free(__ptr);
  return;
}

Assistant:

void ScalePlaneBilinearUp_16(int src_width,
                             int src_height,
                             int dst_width,
                             int dst_height,
                             int src_stride,
                             int dst_stride,
                             const uint16_t* src_ptr,
                             uint16_t* dst_ptr,
                             enum FilterMode filtering) {
  int j;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  const int max_y = (src_height - 1) << 16;
  void (*InterpolateRow)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_16_C;
  void (*ScaleFilterCols)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                          int dst_width, int x, int dx) =
      filtering ? ScaleFilterCols_16_C : ScaleCols_16_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    InterpolateRow = InterpolateRow_Any_16_SSE2;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSE2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_16_SSSE3;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_16_AVX2;
    if (IS_ALIGNED(dst_width, 32)) {
      InterpolateRow = InterpolateRow_16_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_16_NEON;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_16_NEON;
    }
  }
#endif

  if (filtering && src_width >= 32768) {
    ScaleFilterCols = ScaleFilterCols64_16_C;
  }
#if defined(HAS_SCALEFILTERCOLS_16_SSSE3)
  if (filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_16_SSSE3;
  }
#endif
  if (!filtering && src_width * 2 == dst_width && x < 0x8000) {
    ScaleFilterCols = ScaleColsUp2_16_C;
#if defined(HAS_SCALECOLS_16_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_16_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_16_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_16_MMI;
    }
#endif
  }

  if (y > max_y) {
    y = max_y;
  }
  {
    int yi = y >> 16;
    const uint16_t* src = src_ptr + yi * src_stride;

    // Allocate 2 row buffers.
    const int kRowSize = (dst_width + 31) & ~31;
    align_buffer_64(row, kRowSize * 4);

    uint16_t* rowptr = (uint16_t*)row;
    int rowstride = kRowSize;
    int lasty = yi;

    ScaleFilterCols(rowptr, src, dst_width, x, dx);
    if (src_height > 1) {
      src += src_stride;
    }
    ScaleFilterCols(rowptr + rowstride, src, dst_width, x, dx);
    src += src_stride;

    for (j = 0; j < dst_height; ++j) {
      yi = y >> 16;
      if (yi != lasty) {
        if (y > max_y) {
          y = max_y;
          yi = y >> 16;
          src = src_ptr + yi * src_stride;
        }
        if (yi != lasty) {
          ScaleFilterCols(rowptr, src, dst_width, x, dx);
          rowptr += rowstride;
          rowstride = -rowstride;
          lasty = yi;
          src += src_stride;
        }
      }
      if (filtering == kFilterLinear) {
        InterpolateRow(dst_ptr, rowptr, 0, dst_width, 0);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(dst_ptr, rowptr, rowstride, dst_width, yf);
      }
      dst_ptr += dst_stride;
      y += dy;
    }
    free_aligned_buffer_64(row);
  }
}